

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ei_kissfft_impl.h
# Opt level: O3

void __thiscall
Eigen::internal::kissfft_impl<double>::fwd
          (kissfft_impl<double> *this,Complex *dst,Scalar *src,int nfft)

{
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this_00;
  pointer pcVar1;
  undefined1 auVar2 [16];
  Complex *pCVar3;
  mapped_type *pmVar4;
  mapped_type *this_01;
  size_t __n;
  long lVar5;
  Complex *pCVar6;
  int nfft_00;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  undefined1 local_68 [16];
  ulong local_58;
  complex<double> *local_50;
  undefined1 local_48 [16];
  double local_38;
  
  nfft_00 = nfft >> 1;
  if ((nfft & 3U) == 0) {
    local_58 = CONCAT44(local_58._4_4_,nfft >> 2);
    local_68._0_4_ = nfft >> 2;
    local_50 = (complex<double> *)src;
    this_01 = std::
              map<int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
              ::operator[](&this->m_realTwiddles,(key_type *)local_68);
    if (local_68._0_4_ !=
        (int)((ulong)((long)(this_01->
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this_01->
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
                (this_01,(long)(int)local_68._0_4_);
      if (0 < (int)local_68._0_4_) {
        local_48._0_8_ = (double)(local_68._0_4_ * 2);
        lVar5 = 8;
        lVar7 = 0;
        do {
          lVar7 = lVar7 + 1;
          dVar10 = ((double)(int)lVar7 / (double)local_48._0_8_ + 0.5) * -3.141592653589793;
          dVar9 = cexp(0.0);
          pcVar1 = (this_01->
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          *(double *)(pcVar1->_M_value + lVar5 + -8) = dVar9;
          *(double *)(pcVar1->_M_value + lVar5) = dVar10;
          lVar5 = lVar5 + 0x10;
        } while (lVar7 < (int)local_68._0_4_);
      }
    }
    pcVar1 = (this_01->
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    local_68._0_4_ = nfft;
    pmVar4 = std::
             map<int,_Eigen::internal::kiss_cpx_fft<double>,_std::less<int>,_std::allocator<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>_>
             ::operator[](&this->m_plans,(key_type *)local_68);
    if ((pmVar4->m_twiddles).
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (pmVar4->m_twiddles).
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_start) {
      kiss_cpx_fft<double>::make_twiddles(pmVar4,nfft_00,false);
      kiss_cpx_fft<double>::factorize(pmVar4,nfft_00);
    }
    kiss_cpx_fft<double>::work<std::complex<double>>(pmVar4,0,dst,local_50,1,1);
    local_38 = *(double *)dst->_M_value + *(double *)(dst->_M_value + 8);
    local_50 = (complex<double> *)(*(double *)dst->_M_value - *(double *)(dst->_M_value + 8));
    if ((int)local_58 < 1) {
      local_58 = (ulong)nfft_00;
    }
    else {
      uVar8 = local_58 & 0xffffffff;
      lVar5 = 0;
      pCVar3 = dst + nfft_00;
      local_58 = (long)nfft_00;
      do {
        pCVar6 = pCVar3 + -1;
        dVar10 = *(double *)(dst[1]._M_value + lVar5);
        dVar9 = *(double *)((long)(dst[1]._M_value + lVar5) + 8);
        local_68._8_8_ = dVar9 + *(double *)(pCVar3[-1]._M_value + 8);
        local_68._0_8_ = dVar10 - *(double *)pCVar6->_M_value;
        dVar9 = dVar9 - *(double *)(pCVar3[-1]._M_value + 8);
        local_48._8_4_ = SUB84(dVar9,0);
        local_48._0_8_ = dVar10 + *(double *)pCVar6->_M_value;
        local_48._12_4_ = (int)((ulong)dVar9 >> 0x20);
        std::complex<double>::operator*=
                  ((complex<double> *)local_68,(complex<double> *)(pcVar1->_M_value + lVar5));
        dVar10 = ((double)local_48._8_8_ + (double)local_68._8_8_) * 0.5;
        auVar2._8_4_ = SUB84(dVar10,0);
        auVar2._0_8_ = ((double)local_48._0_8_ + (double)local_68._0_8_) * 0.5;
        auVar2._12_4_ = (int)((ulong)dVar10 >> 0x20);
        *(undefined1 (*) [16])(dst[1]._M_value + lVar5) = auVar2;
        *(double *)pCVar6->_M_value = ((double)local_48._0_8_ - (double)local_68._0_8_) * 0.5;
        *(double *)(pCVar3[-1]._M_value + 8) =
             ((double)local_48._8_8_ - (double)local_68._8_8_) * -0.5;
        lVar5 = lVar5 + 0x10;
        pCVar3 = pCVar6;
      } while (uVar8 << 4 != lVar5);
    }
    *(double *)dst->_M_value = local_38;
    *(undefined8 *)(dst->_M_value + 8) = 0;
    *(complex<double> **)dst[local_58]._M_value = local_50;
    *(undefined8 *)(dst[local_58]._M_value + 8) = 0;
  }
  else {
    this_00 = &this->m_tmpBuf1;
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
              (this_00,(long)nfft);
    local_68._0_4_ = nfft * 2;
    pmVar4 = std::
             map<int,_Eigen::internal::kiss_cpx_fft<double>,_std::less<int>,_std::allocator<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>_>
             ::operator[](&this->m_plans,(key_type *)local_68);
    if ((pmVar4->m_twiddles).
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (pmVar4->m_twiddles).
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_start) {
      kiss_cpx_fft<double>::make_twiddles(pmVar4,nfft,false);
      kiss_cpx_fft<double>::factorize(pmVar4,nfft);
    }
    kiss_cpx_fft<double>::work<double>
              (pmVar4,0,(this_00->
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,src,1,1);
    __n = (long)nfft_00 * 0x10 + 0x10;
    if (__n != 0) {
      memmove(dst,(this_00->
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                  _M_impl.super__Vector_impl_data._M_start,__n);
    }
  }
  return;
}

Assistant:

inline
    void fwd( Complex * dst,const Scalar * src,int nfft) 
    {
      if ( nfft&3  ) {
        // use generic mode for odd
        m_tmpBuf1.resize(nfft);
        get_plan(nfft,false).work(0, &m_tmpBuf1[0], src, 1,1);
        std::copy(m_tmpBuf1.begin(),m_tmpBuf1.begin()+(nfft>>1)+1,dst );
      }else{
        int ncfft = nfft>>1;
        int ncfft2 = nfft>>2;
        Complex * rtw = real_twiddles(ncfft2);

        // use optimized mode for even real
        fwd( dst, reinterpret_cast<const Complex*> (src), ncfft);
        Complex dc(dst[0].real() +  dst[0].imag());
        Complex nyquist(dst[0].real() -  dst[0].imag());
        int k;
        for ( k=1;k <= ncfft2 ; ++k ) {
          Complex fpk = dst[k];
          Complex fpnk = conj(dst[ncfft-k]);
          Complex f1k = fpk + fpnk;
          Complex f2k = fpk - fpnk;
          Complex tw= f2k * rtw[k-1];
          dst[k] =  (f1k + tw) * Scalar(.5);
          dst[ncfft-k] =  conj(f1k -tw)*Scalar(.5);
        }
        dst[0] = dc;
        dst[ncfft] = nyquist;
      }
    }